

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hdr_destroy(bcf_hdr_t *h)

{
  uint *__ptr;
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    __ptr = (uint *)h->dict[lVar5];
    if (__ptr != (uint *)0x0) {
      if (*__ptr != 0) {
        bVar2 = 0;
        uVar4 = 0;
        do {
          if ((*(uint *)(*(long *)(__ptr + 4) + (uVar4 >> 4) * 4) >> (bVar2 & 0x1e) & 3) == 0) {
            free(*(void **)(*(long *)(__ptr + 6) + uVar4 * 8));
          }
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
          bVar2 = bVar2 + 2;
        } while (uVar3 != *__ptr);
      }
      free(*(void **)(__ptr + 6));
      free(*(void **)(__ptr + 4));
      free(*(void **)(__ptr + 8));
      free(__ptr);
      free(h->id[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  iVar1 = h->nhrec;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      bcf_hrec_destroy(h->hrec[lVar5]);
      lVar5 = lVar5 + 1;
      iVar1 = h->nhrec;
    } while (lVar5 < iVar1);
  }
  if (iVar1 != 0) {
    free(h->hrec);
  }
  if (h->samples != (char **)0x0) {
    free(h->samples);
  }
  free(h->keep_samples);
  free(h->transl[0]);
  free(h->transl[1]);
  free((h->mem).s);
  free(h);
  return;
}

Assistant:

void bcf_hdr_destroy(bcf_hdr_t *h)
{
    int i;
    khint_t k;
    for (i = 0; i < 3; ++i) {
        vdict_t *d = (vdict_t*)h->dict[i];
        if (d == 0) continue;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);
        free(h->id[i]);
    }
    for (i=0; i<h->nhrec; i++)
        bcf_hrec_destroy(h->hrec[i]);
    if (h->nhrec) free(h->hrec);
    if (h->samples) free(h->samples);
    free(h->keep_samples);
    free(h->transl[0]); free(h->transl[1]);
    free(h->mem.s);
    free(h);
}